

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenChain.h
# Opt level: O2

void __thiscall
adios2::shm::TokenChain<unsigned_long>::TokenChain(TokenChain<unsigned_long> *this,Comm *comm)

{
  Win *this_00;
  int iVar1;
  size_t shmsize;
  char *ptr;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  int disp_unit;
  
  this->m_NodeComm = comm;
  iVar1 = helper::Comm::Rank(comm);
  this->m_Rank = iVar1;
  iVar1 = helper::Comm::Size(comm);
  this->m_nProc = iVar1;
  this_00 = &this->m_Win;
  helper::Comm::Win::Win(this_00);
  if (this->m_nProc < 2) {
    ptr = (char *)operator_new(0x10);
    this->m_Shm = (segment_ *)ptr;
  }
  else {
    if (this->m_Rank == 0) {
      local_48._0_8_ = &local_38;
      local_48._8_8_ = 0;
      local_38._M_local_buf[0] = '\0';
      helper::Comm::Win_allocate_shared
                ((Comm *)&shmsize,(size_t)this->m_NodeComm,0x10,(void *)0x1,(string *)&ptr);
      helper::Comm::Win::operator=(this_00,(Win *)&shmsize);
      helper::Comm::Win::~Win((Win *)&shmsize);
    }
    else {
      local_48._8_8_ = 0;
      local_38._M_local_buf[0] = '\0';
      local_48._0_8_ = &local_38;
      helper::Comm::Win_allocate_shared
                ((Comm *)&shmsize,(size_t)this->m_NodeComm,0,(void *)0x1,(string *)&ptr);
      helper::Comm::Win::operator=(this_00,(Win *)&shmsize);
      helper::Comm::Win::~Win((Win *)&shmsize);
      std::__cxx11::string::~string((string *)local_48);
      local_48._8_8_ = 0;
      local_38._M_local_buf[0] = '\0';
      local_48._0_8_ = &local_38;
      helper::Comm::Win_shared_query
                (this->m_NodeComm,this_00,0,&shmsize,&disp_unit,&ptr,(string *)local_48);
    }
    std::__cxx11::string::~string((string *)local_48);
    this->m_Shm = (segment_ *)ptr;
    if (this->m_Rank != 0) {
      return;
    }
  }
  ((segment_ *)ptr)->currentRank = 0;
  ((segment_ *)ptr)->token = 0;
  return;
}

Assistant:

TokenChain(helper::Comm *comm) : m_NodeComm(comm), m_Rank(comm->Rank()), m_nProc(comm->Size())
    {
        if (m_nProc > 1)
        {
            char *ptr;
            if (!m_Rank)
            {
                m_Win = m_NodeComm->Win_allocate_shared(sizeof(segment_), 1, &ptr);
            }
            else
            {
                m_Win = m_NodeComm->Win_allocate_shared(0, 1, &ptr);
                size_t shmsize;
                int disp_unit;
                m_NodeComm->Win_shared_query(m_Win, 0, &shmsize, &disp_unit, &ptr);
            }
            m_Shm = reinterpret_cast<segment_ *>(ptr);

            if (!m_Rank)
            {
                m_Shm->currentRank = 0;
                m_Shm->token = T();
            }
        }
        else
        {
            m_Shm = new segment_;
            m_Shm->currentRank = 0;
            m_Shm->token = T();
        }
    }